

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.cpp
# Opt level: O1

size_t fibonacci(char *key,int len,uint32_t seed)

{
  long lVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  uint8_t *dc;
  long *plVar5;
  ulong uVar6;
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar7 [16];
  
  uVar4 = (ulong)seed;
  uVar6 = (ulong)len;
  plVar5 = (long *)key;
  if (0 < (long)(uVar6 & 0xfffffffffffffff8)) {
    do {
      lVar1 = *plVar5;
      plVar5 = plVar5 + 1;
      uVar4 = uVar4 + lVar1 * -0x61c8864680b583eb;
    } while (plVar5 < key + (uVar6 & 0xfffffffffffffff8));
  }
  if (plVar5 < key + uVar6 && (uVar6 & 7) != 0) {
    auVar14 = ZEXT864(uVar4);
    auVar10 = vpbroadcastq_avx512f();
    uVar4 = 0;
    auVar11 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar12 = vpbroadcastq_avx512f(ZEXT816(0x9e3779b97f4a7c15));
    do {
      auVar13 = vmovdqa64_avx512f(auVar14);
      auVar14 = vpbroadcastq_avx512f();
      auVar14 = vporq_avx512f(auVar14,auVar11);
      uVar3 = vpcmpuq_avx512f(auVar14,auVar10,2);
      auVar7 = vmovdqu8_avx512vl(*(undefined1 (*) [16])((long)plVar5 + uVar4));
      auVar8[1] = ((byte)(uVar3 >> 1) & 1) * auVar7[1];
      auVar8[0] = ((byte)uVar3 & 1) * auVar7[0];
      auVar8[2] = ((byte)(uVar3 >> 2) & 1) * auVar7[2];
      auVar8[3] = ((byte)(uVar3 >> 3) & 1) * auVar7[3];
      auVar8[4] = ((byte)(uVar3 >> 4) & 1) * auVar7[4];
      auVar8[5] = ((byte)(uVar3 >> 5) & 1) * auVar7[5];
      auVar8[6] = ((byte)(uVar3 >> 6) & 1) * auVar7[6];
      auVar8[7] = (char)(uVar3 >> 7) * auVar7[7];
      auVar8._8_8_ = 0;
      auVar14 = vpmovzxbq_avx512f(auVar8);
      auVar14 = vpmullq_avx512dq(auVar14,auVar12);
      auVar14 = vpaddq_avx512f(auVar14,auVar13);
      uVar4 = uVar4 + 8;
    } while (((long)(key + uVar6) + (7 - (long)plVar5) & 0xfffffffffffffff8U) != uVar4);
    auVar10 = vmovdqa64_avx512f(auVar14);
    bVar2 = (bool)((byte)uVar3 & 1);
    auVar11._0_8_ = (ulong)bVar2 * auVar10._0_8_ | (ulong)!bVar2 * auVar13._0_8_;
    bVar2 = (bool)((byte)(uVar3 >> 1) & 1);
    auVar11._8_8_ = (ulong)bVar2 * auVar10._8_8_ | (ulong)!bVar2 * auVar13._8_8_;
    bVar2 = (bool)((byte)(uVar3 >> 2) & 1);
    auVar11._16_8_ = (ulong)bVar2 * auVar10._16_8_ | (ulong)!bVar2 * auVar13._16_8_;
    bVar2 = (bool)((byte)(uVar3 >> 3) & 1);
    auVar11._24_8_ = (ulong)bVar2 * auVar10._24_8_ | (ulong)!bVar2 * auVar13._24_8_;
    bVar2 = (bool)((byte)(uVar3 >> 4) & 1);
    auVar11._32_8_ = (ulong)bVar2 * auVar10._32_8_ | (ulong)!bVar2 * auVar13._32_8_;
    bVar2 = (bool)((byte)(uVar3 >> 5) & 1);
    auVar11._40_8_ = (ulong)bVar2 * auVar10._40_8_ | (ulong)!bVar2 * auVar13._40_8_;
    bVar2 = (bool)((byte)(uVar3 >> 6) & 1);
    auVar11._48_8_ = (ulong)bVar2 * auVar10._48_8_ | (ulong)!bVar2 * auVar13._48_8_;
    auVar11._56_8_ = (uVar3 >> 7) * auVar10._56_8_ | (ulong)!SUB81(uVar3 >> 7,0) * auVar13._56_8_;
    auVar9 = vextracti64x4_avx512f(auVar11,1);
    auVar10 = vpaddq_avx512f(auVar11,ZEXT3264(auVar9));
    auVar7 = vpaddq_avx(auVar10._0_16_,auVar10._16_16_);
    auVar8 = vpshufd_avx(auVar7,0xee);
    auVar7 = vpaddq_avx(auVar7,auVar8);
    uVar4 = auVar7._0_8_;
  }
  return uVar4;
}

Assistant:

size_t
fibonacci(const char *key, int len, uint32_t seed)
{
  size_t h = (size_t)seed;
  size_t *dw = (size_t *)key; //word stepper
  const size_t *const endw = &((const size_t*)key)[len/sizeof(size_t)];
  while (dw < endw) {
    h += *dw++ * UINT64_C(11400714819323198485);
  }
  if (len & (sizeof(size_t)-1)) {
    uint8_t *dc = (uint8_t*)dw; //byte stepper
    const uint8_t *const endc = &((const uint8_t*)key)[len];
    while (dc < endc) {
      h += *dc++ * UINT64_C(11400714819323198485);
    }
  }
  return h;
}